

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sms_Apu.cpp
# Opt level: O0

void __thiscall
Sms_Apu::output(Sms_Apu *this,Blip_Buffer *center,Blip_Buffer *left,Blip_Buffer *right)

{
  Blip_Buffer *in_RCX;
  Blip_Buffer *in_RDX;
  Blip_Buffer *in_RSI;
  Sms_Apu *in_RDI;
  int i;
  undefined4 local_24;
  
  for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
    osc_output(in_RDI,local_24,in_RSI,in_RDX,in_RCX);
  }
  return;
}

Assistant:

void Sms_Apu::output( Blip_Buffer* center, Blip_Buffer* left, Blip_Buffer* right )
{
	for ( int i = 0; i < osc_count; i++ )
		osc_output( i, center, left, right );
}